

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

int __thiscall ev3dev::sensor::value(sensor *this,uint index)

{
  int iVar1;
  invalid_argument *this_00;
  allocator local_41;
  char svalue [7];
  string local_38;
  
  iVar1 = num_values(this);
  if ((int)index < iVar1) {
    builtin_strncpy(svalue,"value",5);
    svalue[6] = '\0';
    svalue[5] = (char)index + '0';
    std::__cxx11::string::string((string *)&local_38,svalue,&local_41);
    iVar1 = device::get_attr_int(&this->super_device,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return iVar1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"index");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int sensor::value(unsigned index) const {
    if (static_cast<int>(index) >= num_values())
        throw std::invalid_argument("index");

    char svalue[7] = "value0";
    svalue[5] += index;

    return get_attr_int(svalue);
}